

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_term(nn_sock *self)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  int local_18;
  int i;
  int rc;
  nn_sock *self_local;
  
  do {
    iVar2 = nn_sem_wait(&self->termsem);
  } while (iVar2 == -4);
  if (iVar2 == 0) {
    do {
      iVar2 = nn_sem_wait(&self->relesem);
    } while (iVar2 == -4);
    if (iVar2 == 0) {
      nn_ctx_enter(&self->ctx);
      nn_ctx_leave(&self->ctx);
      if ((self->socktype->flags & 1U) == 0) {
        nn_efd_term(&self->rcvfd);
      }
      if ((self->socktype->flags & 2U) == 0) {
        nn_efd_term(&self->sndfd);
      }
      nn_fsm_stopped_noevent(&self->fsm);
      nn_fsm_term(&self->fsm);
      nn_sem_term(&self->termsem);
      nn_sem_term(&self->relesem);
      nn_list_term(&self->sdeps);
      nn_list_term(&self->eps);
      nn_ctx_term(&self->ctx);
      for (local_18 = 0; local_18 != 4; local_18 = local_18 + 1) {
        if (self->optsets[local_18] != (nn_optset *)0x0) {
          (*self->optsets[local_18]->vfptr->destroy)(self->optsets[local_18]);
        }
      }
      return 0;
    }
    nn_backtrace_print();
    pFVar1 = _stderr;
    pcVar3 = nn_err_strerror(-iVar2);
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/sock.c",
            0xd5);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_backtrace_print();
  pFVar1 = _stderr;
  pcVar3 = nn_err_strerror(-iVar2);
  fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/sock.c",0xcc
         );
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_sock_term (struct nn_sock *self)
{
    int rc;
    int i;

    /*  NOTE: nn_sock_stop must have already been called. */

    /*  Some endpoints may still be alive.  Here we are going to wait
        till they are all closed.  This loop is not interruptible, because
        making it so would leave a partially cleaned up socket, and we don't
        have a way to defer resource deallocation. */
    for (;;) {
        rc = nn_sem_wait (&self->termsem);
        if (nn_slow (rc == -EINTR))
            continue;
        errnum_assert (rc == 0, -rc);
        break;
    }

    /*  Also, wait for all holds on the socket to be released.  */
    for (;;) {
        rc = nn_sem_wait (&self->relesem);
        if (nn_slow (rc == -EINTR))
            continue;
        errnum_assert (rc == 0, -rc);
        break;
    }

    /*  Threads that posted the semaphore(s) can still have the ctx locked
        for a short while. By simply entering the context and exiting it
        immediately we can be sure that any such threads have already
        exited the context. */
    nn_ctx_enter (&self->ctx);
    nn_ctx_leave (&self->ctx);

    /*  At this point, we can be reasonably certain that no other thread
        has any references to the socket. */

    /*  Close the event FDs entirely. */
    if (!(self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)) {
        nn_efd_term (&self->rcvfd);
    }
    if (!(self->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)) {
        nn_efd_term (&self->sndfd);
    }

    nn_fsm_stopped_noevent (&self->fsm);
    nn_fsm_term (&self->fsm);
    nn_sem_term (&self->termsem);
    nn_sem_term (&self->relesem);
    nn_list_term (&self->sdeps);
    nn_list_term (&self->eps);
    nn_ctx_term (&self->ctx);

    /*  Destroy any optsets associated with the socket. */
    for (i = 0; i != NN_MAX_TRANSPORT; ++i)
        if (self->optsets [i])
            self->optsets [i]->vfptr->destroy (self->optsets [i]);

    return 0;
}